

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O0

void __thiscall
QPicturePaintEngine::drawPixmap(QPicturePaintEngine *this,QRectF *r,QPixmap *pm,QRectF *sr)

{
  int iVar1;
  QPicturePaintEnginePrivate *pixmap;
  qsizetype qVar2;
  QDataStream *pQVar3;
  QDataStream *in_RCX;
  QRectF *in_RSI;
  parameter_type in_RDI;
  int index;
  int pos;
  QPicturePaintEnginePrivate *d;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  
  pixmap = d_func((QPicturePaintEngine *)0x310f7a);
  uVar4 = 0xaaaaaaaa;
  pixmap->pic_d->trecs = pixmap->pic_d->trecs + 1;
  QDataStream::operator<<
            ((QDataStream *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd0),
             (quint8)((ulong)in_RDI >> 0x38));
  QDataStream::operator<<
            ((QDataStream *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (quint8)((ulong)in_RDI >> 0x38));
  uVar4 = QBuffer::pos();
  if ((pixmap->pic_d->in_memory_only & 1U) == 0) {
    ::operator<<(&pixmap->s,in_RSI);
    pQVar3 = ::operator<<(in_RCX,(QPixmap *)pixmap);
    ::operator<<(pQVar3,(QRectF *)in_RCX);
  }
  else {
    qVar2 = QList<QPixmap>::size(&pixmap->pic_d->pixmap_list);
    iVar1 = (int)qVar2;
    QList<QPixmap>::append((QList<QPixmap> *)CONCAT44(uVar4,iVar1),in_RDI);
    pQVar3 = (QDataStream *)::operator<<(&pixmap->s,in_RSI);
    pQVar3 = (QDataStream *)QDataStream::operator<<(pQVar3,iVar1);
    ::operator<<(pQVar3,(QRectF *)in_RCX);
  }
  writeCmdLength((QPicturePaintEngine *)pm,sr._4_4_,(QRectF *)d,pos._3_1_);
  return;
}

Assistant:

void QPicturePaintEngine::drawPixmap(const QRectF &r, const QPixmap &pm, const QRectF &sr)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> drawPixmap():" << r;
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcDrawPixmap);

    if (d->pic_d->in_memory_only) {
        int index = d->pic_d->pixmap_list.size();
        d->pic_d->pixmap_list.append(pm);
        d->s << r << index << sr;
    } else {
        d->s << r << pm << sr;
    }
    writeCmdLength(pos, r, false);
}